

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

void constant_time_conditional_memxor(void *dst,void *src,size_t n,crypto_word_t mask)

{
  size_t i;
  long lVar1;
  
  if ((void *)((long)dst + 0x60U) <= src || (void *)((long)src + 0x60U) <= dst) {
    for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 1) {
      *(byte *)((long)dst + lVar1) =
           *(byte *)((long)dst + lVar1) ^ *(byte *)((long)src + lVar1) & (byte)n;
    }
    return;
  }
  __assert_fail("!buffers_alias(dst, n, src, n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/../internal.h"
                ,0x1ab,
                "void constant_time_conditional_memxor(void *, const void *, size_t, const crypto_word_t)"
               );
}

Assistant:

static inline int buffers_alias(const void *a, size_t a_bytes, const void *b,
                                size_t b_bytes) {
  // Cast |a| and |b| to integers. In C, pointer comparisons between unrelated
  // objects are undefined whereas pointer to integer conversions are merely
  // implementation-defined. We assume the implementation defined it in a sane
  // way.
  uintptr_t a_u = (uintptr_t)a;
  uintptr_t b_u = (uintptr_t)b;
  return a_u + a_bytes > b_u && b_u + b_bytes > a_u;
}